

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

Vector3 __thiscall xatlas::internal::Mesh::computeFaceCenter(Mesh *this,uint32_t face)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint8_t *puVar8;
  uint uVar9;
  char *__function;
  float fVar10;
  float fVar11;
  float fVar15;
  float fVar14;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  Vector3 VVar22;
  
  uVar9 = face * 3;
  uVar4 = (this->m_indices).m_base.size;
  if (uVar9 < uVar4) {
    puVar8 = (this->m_indices).m_base.buffer;
    uVar5 = *(uint *)(puVar8 + (ulong)uVar9 * 4);
    uVar6 = (this->m_positions).m_base.size;
    if (uVar5 < uVar6) {
      if (uVar4 <= uVar9 + 1) goto LAB_001afae0;
      uVar7 = *(uint *)(puVar8 + (ulong)(uVar9 + 1) * 4);
      if (uVar7 < uVar6) {
        if (uVar4 <= uVar9 + 2) goto LAB_001afae0;
        uVar4 = *(uint *)(puVar8 + (ulong)(uVar9 + 2) * 4);
        if (uVar4 < uVar6) {
          puVar8 = (this->m_positions).m_base.buffer;
          fVar1 = *(float *)(puVar8 + (ulong)uVar7 * 0xc + 8);
          fVar2 = *(float *)(puVar8 + (ulong)uVar4 * 0xc + 8);
          fVar17 = (float)*(undefined8 *)(puVar8 + (ulong)uVar4 * 0xc);
          fVar18 = (float)((ulong)*(undefined8 *)(puVar8 + (ulong)uVar4 * 0xc) >> 0x20);
          fVar10 = (float)*(undefined8 *)(puVar8 + (ulong)uVar7 * 0xc);
          fVar14 = (float)((ulong)*(undefined8 *)(puVar8 + (ulong)uVar7 * 0xc) >> 0x20);
          fVar19 = SQRT((fVar2 - fVar1) * (fVar2 - fVar1) +
                        (fVar17 - fVar10) * (fVar17 - fVar10) +
                        (fVar18 - fVar14) * (fVar18 - fVar14));
          fVar20 = (float)*(undefined8 *)(puVar8 + (ulong)uVar5 * 0xc);
          fVar21 = (float)((ulong)*(undefined8 *)(puVar8 + (ulong)uVar5 * 0xc) >> 0x20);
          fVar3 = *(float *)(puVar8 + (ulong)uVar5 * 0xc + 8);
          auVar12._0_4_ = (fVar21 - fVar18) * (fVar21 - fVar18);
          auVar12._4_4_ = (fVar14 - fVar21) * (fVar14 - fVar21);
          auVar12._8_8_ = 0;
          auVar13._4_4_ =
               (fVar1 - fVar3) * (fVar1 - fVar3) +
               (fVar10 - fVar20) * (fVar10 - fVar20) + auVar12._4_4_;
          auVar13._0_4_ =
               (fVar3 - fVar2) * (fVar3 - fVar2) +
               (fVar20 - fVar17) * (fVar20 - fVar17) + auVar12._0_4_;
          auVar13._8_4_ = (fVar21 - fVar18) * (fVar21 - fVar18) + 0.0 + 0.0;
          auVar13._12_4_ = (fVar14 - fVar21) * (fVar14 - fVar21) + 0.0 + 0.0;
          auVar13 = sqrtps(auVar12,auVar13);
          fVar11 = auVar13._0_4_;
          fVar15 = auVar13._4_4_;
          fVar16 = 1.0 / (fVar15 + fVar19 + fVar11);
          VVar22.x = fVar11 * (fVar20 + fVar17) * fVar16 +
                     fVar19 * (fVar10 + fVar17) * fVar16 + (fVar10 + fVar20) * fVar15 * fVar16;
          VVar22.y = fVar11 * (fVar21 + fVar18) * fVar16 +
                     fVar19 * (fVar14 + fVar18) * fVar16 + (fVar14 + fVar21) * fVar15 * fVar16;
          VVar22.z = (fVar3 + fVar1) * fVar15 * fVar16 + (fVar1 + fVar2) * fVar19 * fVar16 +
                     (fVar3 + fVar2) * fVar11 * fVar16;
          return VVar22;
        }
      }
    }
    __function = 
    "const T &xatlas::internal::Array<xatlas::internal::Vector3>::operator[](uint32_t) const [T = xatlas::internal::Vector3]"
    ;
  }
  else {
LAB_001afae0:
    __function = 
    "const T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) const [T = unsigned int]";
  }
  __assert_fail("index < m_base.size",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                ,0x4a8,__function);
}

Assistant:

Vector3 computeFaceCenter(uint32_t face) const
	{
		const Vector3 &p0 = m_positions[m_indices[face * 3 + 0]];
		const Vector3 &p1 = m_positions[m_indices[face * 3 + 1]];
		const Vector3 &p2 = m_positions[m_indices[face * 3 + 2]];
		const float l0 = length(p1 - p0);
		const float l1 = length(p2 - p1);
		const float l2 = length(p0 - p2);
		const Vector3 m0 = (p0 + p1) * l0 / (l0 + l1 + l2);
		const Vector3 m1 = (p1 + p2) * l1 / (l0 + l1 + l2);
		const Vector3 m2 = (p2 + p0) * l2 / (l0 + l1 + l2);
		return m0 + m1 + m2;
	}